

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O1

string * namingConventions::editToNewName
                   (string *__return_storage_ptr__,string *word,string *oldName,string *correctName)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  pointer local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  string *local_40;
  string *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = '\0';
  uVar14 = word->_M_string_length;
  if (uVar14 == 0) {
    bVar16 = true;
    uVar4 = 0;
    uVar8 = 0;
    uVar7 = 0;
    bVar3 = false;
  }
  else {
    uVar10 = 0;
    uVar13 = 0;
    bVar3 = false;
    uVar7 = 0;
    iVar11 = 0;
    uVar9 = 0;
    uVar5 = 0;
    uVar12 = 0;
    do {
      bVar1 = (word->_M_dataplus)._M_p[uVar10];
      uVar4 = (uint)uVar10;
      if (bVar1 != 0x28) {
        uVar4 = uVar7;
      }
      uVar7 = uVar4;
      if ((bVar1 != (oldName->_M_dataplus)._M_p[uVar13]) || (bVar3)) {
        if ((bVar1 & 0xfe) != 0x28) {
          iVar11 = iVar11 + (uint)(bVar1 != 0x3b);
        }
        uVar12 = 0;
        bVar3 = false;
        uVar13 = 0;
      }
      else if (oldName->_M_string_length - 1 == (ulong)uVar12) {
        if (uVar12 == 0) {
          uVar5 = uVar10 & 0xffffffff;
        }
        bVar3 = true;
        uVar9 = uVar10 & 0xffffffff;
      }
      else {
        uVar13 = (ulong)((int)uVar13 + 1);
        bVar16 = uVar12 == 0;
        uVar12 = uVar12 + 1;
        if (bVar16) {
          uVar5 = uVar10 & 0xffffffff;
        }
      }
      uVar8 = (uint)uVar9;
      uVar4 = (uint)uVar5;
      uVar10 = uVar10 + 1;
    } while ((uVar10 & 0xffffffff) < uVar14);
    bVar16 = iVar11 == 0;
    local_40 = __return_storage_ptr__;
  }
  local_38 = correctName;
  if (bVar16) {
    if (uVar4 != 0) {
      uVar14 = 0;
      do {
        std::__cxx11::string::push_back((char)&local_60);
        uVar14 = uVar14 + 1;
      } while (uVar4 != uVar14);
    }
    std::__cxx11::string::_M_append((char *)&local_60,(ulong)(local_38->_M_dataplus)._M_p);
    while (uVar8 = uVar8 + 1, (ulong)uVar8 < word->_M_string_length) {
      std::__cxx11::string::push_back((char)&local_60);
    }
    paVar6 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  }
  else {
    if (uVar7 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (word->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar14);
      goto LAB_00131de9;
    }
    if (bVar3) {
      local_40 = __return_storage_ptr__;
      if (uVar7 != 0xffffffff) {
        lVar15 = 0;
        do {
          std::__cxx11::string::push_back((char)&local_60);
          lVar15 = lVar15 + 1;
        } while ((ulong)uVar7 + 1 != lVar15);
      }
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)(local_38->_M_dataplus)._M_p);
      __return_storage_ptr__ = local_40;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_60);
      if ((ulong)uVar7 < word->_M_string_length) {
        do {
          uVar7 = uVar7 + 1;
          std::__cxx11::string::push_back((char)&local_60);
        } while ((ulong)uVar7 < word->_M_string_length);
      }
    }
    paVar6 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  }
  if (local_60 == &local_50) {
    paVar6->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)paVar6 + 8) = uStack_48;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_60;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  __return_storage_ptr__->_M_string_length = local_58;
  local_58 = 0;
  local_50 = '\0';
  local_60 = &local_50;
LAB_00131de9:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
namingConventions::editToNewName(std::string &word, const std::string &oldName, const std::string &correctName) {
    unsigned int correctCount = 0;
    unsigned int start = 0;
    unsigned int end = 0;
    unsigned int misses = 0;
    std::string newName;
    unsigned int functionCall = 0;

    bool found = false;
    unsigned int oldname_i = 0;

    // zoekt start en eindpunt van gezochte naam in stukje tekst, telt het aantal misses, etc..
    for (unsigned int c = 0; c < word.size(); ++c) {
      if(word[c] == '('){
        functionCall = c;
      }

        if (word[c] == oldName[oldname_i] && !found) {
            if (correctCount == oldName.size() - 1) {
                end = c;
                found = true;
                if(correctCount == 0){
                  start = c;
                }
            } else {
                correctCount += 1;
                oldname_i += 1;
                if (correctCount == 1) {
                    start = c;
                }
            }

        } else {
            correctCount = 0;
            found = false;
            oldname_i = 0;
            if(word[c] != '(' && word[c] != ')' && word[c] != ';' )
            misses += 1;
        }
    }

    // past de tekst aan
    if(misses > 0){
      if(functionCall != 0 && found){
        unsigned int pos = 0;
        while (pos != functionCall + 1) { //variable in function call
          newName += word[pos];
          pos += 1;
        }
        newName += correctName;
        return newName;

      }else if(functionCall != 0){  // function being called
        newName = correctName;
        while (functionCall < word.size()) {
          newName += word[functionCall];
          functionCall += 1;
        }
        return newName;
      }
      return word;
    }
    unsigned int pos = 0;
    while (pos != start) {
        newName += word[pos];
        pos += 1;
    }
    newName += correctName;
    pos = end + 1;
    while (pos < word.size()) {
        newName += word[pos];
        pos += 1;
    }
    return newName;

}